

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_jsonreport.cpp
# Opt level: O2

int test_jsonreport_escape(ITesting *t)

{
  ResultSummary *this;
  Ref result;
  shared_ptr<trun::TestFunc> tfunc;
  AssertError assertError;
  ResultsReportJSON jsonReport;
  string assertErrMsg;
  undefined1 local_108 [32];
  AssertError local_e8;
  ResultsReportJSON local_c8;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::make_shared<trun::TestFunc>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"dummy",(allocator<char> *)&local_e8);
  trun::TestResult::Create((string *)local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  *(kTestResult *)(local_108._0_8_ + 0x41) = kTestResult_TestFail;
  local_e8._vptr_AssertError = (_func_int **)&PTR__AssertError_0023c770;
  local_e8.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"fopen(\"filename.txt\",\"r\");",(allocator<char> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"dummy.cpp",(allocator<char> *)&local_c8);
  std::__cxx11::string::string((string *)&local_70,&local_30);
  trun::AssertError::Add(&local_e8,kAssert_Error,0,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  trun::TestResult::SetAssertError((TestResult *)local_108._0_8_,&local_e8);
  std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,(__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *)local_108);
  std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *)(local_108._16_8_ + 0xb0)
             ,&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  this = trun::ResultSummary::Instance();
  std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x10));
  trun::ResultSummary::AddResult(this,(Ref *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  trun::ResultsReportJSON::ResultsReportJSON(&local_c8);
  trun::ResultsReportJSON::Begin(&local_c8);
  trun::ResultsReportJSON::PrintReport(&local_c8);
  trun::ResultsReportJSON::End(&local_c8);
  trun::ResultsReportPinterBase::~ResultsReportPinterBase(&local_c8.super_ResultsReportPinterBase);
  std::__cxx11::string::~string((string *)&local_30);
  trun::AssertError::~AssertError(&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x18));
  return 0;
}

Assistant:

DLL_EXPORT int test_jsonreport_escape(ITesting *t) {
    auto tfunc = std::make_shared<trun::TestFunc>();
    auto result = trun::TestResult::Create("dummy");
    result->SetResult(trun::kTestResult_TestFail);
    trun::AssertError assertError;
    auto assertErrMsg = std::string("fopen(\"filename.txt\",\"r\");");
    assertError.Add(trun::AssertError::kAssert_Error, 0, "dummy.cpp", assertErrMsg);
    result->SetAssertError(assertError);

    tfunc->SetResultFromSubProcess(result);

    // Add this to the global result summary instance
    trun::ResultSummary::Instance().AddResult(tfunc);

    trun::ResultsReportJSON jsonReport;
    jsonReport.Begin();
    jsonReport.PrintReport();
    jsonReport.End();

    // I don't really have an interface to deal with testing the result without loading and doing shit..
    // this is verified through visual inspection of the result!

    return kTR_Pass;
}